

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inspect_chunk(LodePNGState *state,size_t pos,uchar *in,size_t insize)

{
  uchar uVar1;
  uint uVar2;
  uchar *chunk_00;
  LodePNGInfo *info;
  uchar *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  LodePNGInfo *in_RDI;
  uint error;
  uint unhandled;
  uchar *data;
  LodePNGDecoderSettings *in_stack_00000010;
  uint chunkLength;
  uchar *chunk;
  LodePNGInfo *in_stack_00000040;
  int iVar3;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_4;
  
  chunk_00 = in_RSI + in_RDX;
  iVar3 = 0;
  local_4 = 0;
  if (in_RCX < in_RSI + 4) {
    local_4 = 0x1e;
  }
  else {
    uVar2 = lodepng_chunk_length((uchar *)0x1c484d);
    if (uVar2 < 0x80000000) {
      info = (LodePNGInfo *)lodepng_chunk_data_const(chunk_00);
      if ((ulong)((long)in_RCX - (long)in_RSI) < (ulong)(uVar2 + 0xc)) {
        local_4 = 0x1e;
      }
      else {
        uVar1 = lodepng_chunk_type_equals
                          ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)info);
        if (uVar1 == '\0') {
          uVar1 = lodepng_chunk_type_equals
                            ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)info);
          if (uVar1 == '\0') {
            uVar1 = lodepng_chunk_type_equals
                              ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)info);
            if (uVar1 == '\0') {
              uVar1 = lodepng_chunk_type_equals
                                ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)info);
              if (uVar1 == '\0') {
                uVar1 = lodepng_chunk_type_equals
                                  ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)info);
                if (uVar1 == '\0') {
                  uVar1 = lodepng_chunk_type_equals
                                    ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)info
                                    );
                  if (uVar1 == '\0') {
                    uVar1 = lodepng_chunk_type_equals
                                      ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                       (char *)info);
                    if (uVar1 == '\0') {
                      uVar1 = lodepng_chunk_type_equals
                                        ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                         (char *)info);
                      if (uVar1 == '\0') {
                        uVar1 = lodepng_chunk_type_equals
                                          ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                           (char *)info);
                        if (uVar1 == '\0') {
                          uVar1 = lodepng_chunk_type_equals
                                            ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                             (char *)info);
                          if (uVar1 == '\0') {
                            uVar1 = lodepng_chunk_type_equals
                                              ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                               (char *)info);
                            if (uVar1 == '\0') {
                              uVar1 = lodepng_chunk_type_equals
                                                ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                                 (char *)info);
                              if (uVar1 == '\0') {
                                uVar1 = lodepng_chunk_type_equals
                                                  ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8
                                                                    ),(char *)info);
                                if (uVar1 == '\0') {
                                  uVar1 = lodepng_chunk_type_equals
                                                    ((uchar *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffffc8),(char *)info);
                                  if (uVar1 == '\0') {
                                    uVar1 = lodepng_chunk_type_equals
                                                      ((uchar *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffffc8),(char *)info);
                                    if (uVar1 == '\0') {
                                      uVar1 = lodepng_chunk_type_equals
                                                        ((uchar *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffffc8),(char *)info);
                                      if (uVar1 == '\0') {
                                        uVar1 = lodepng_chunk_type_equals
                                                          ((uchar *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffffc8),(char *)info);
                                        if (uVar1 == '\0') {
                                          iVar3 = 1;
                                        }
                                        else {
                                          local_4 = readChunk_sBIT((LodePNGInfo *)
                                                                   &in_RDI->chrm_defined,
                                                                   (uchar *)info,(ulong)uVar2);
                                        }
                                      }
                                      else {
                                        local_4 = readChunk_eXIf(info,(uchar *)CONCAT44(iVar3,
                                                  local_4),0x1c4c38);
                                      }
                                    }
                                    else {
                                      local_4 = readChunk_cLLi((LodePNGInfo *)&in_RDI->chrm_defined,
                                                               (uchar *)info,(ulong)uVar2);
                                    }
                                  }
                                  else {
                                    local_4 = readChunk_mDCv((LodePNGInfo *)&in_RDI->chrm_defined,
                                                             (uchar *)info,(ulong)uVar2);
                                  }
                                }
                                else {
                                  local_4 = readChunk_cICP((LodePNGInfo *)&in_RDI->chrm_defined,
                                                           (uchar *)info,(ulong)uVar2);
                                }
                              }
                              else {
                                local_4 = readChunk_iCCP((LodePNGInfo *)chunk,in_stack_00000010,data
                                                         ,_error);
                              }
                            }
                            else {
                              local_4 = readChunk_sRGB((LodePNGInfo *)&in_RDI->chrm_defined,
                                                       (uchar *)info,(ulong)uVar2);
                            }
                          }
                          else {
                            local_4 = readChunk_cHRM((LodePNGInfo *)&in_RDI->chrm_defined,
                                                     (uchar *)info,(ulong)uVar2);
                          }
                        }
                        else {
                          local_4 = readChunk_gAMA((LodePNGInfo *)&in_RDI->chrm_defined,
                                                   (uchar *)info,(ulong)uVar2);
                        }
                      }
                      else {
                        local_4 = readChunk_pHYs((LodePNGInfo *)&in_RDI->chrm_defined,(uchar *)info,
                                                 (ulong)uVar2);
                      }
                    }
                    else {
                      local_4 = readChunk_tIME((LodePNGInfo *)&in_RDI->chrm_defined,(uchar *)info,
                                               (ulong)uVar2);
                    }
                  }
                  else {
                    local_4 = readChunk_iTXt(in_stack_00000040,&state->decoder,(uchar *)pos,
                                             (size_t)in);
                  }
                }
                else {
                  local_4 = readChunk_zTXt((LodePNGInfo *)insize,(LodePNGDecoderSettings *)chunk,
                                           (uchar *)in_stack_00000010,(size_t)data);
                }
              }
              else {
                local_4 = readChunk_tEXt(in_RDI,in_RSI,in_RDX);
              }
            }
            else {
              local_4 = readChunk_bKGD((LodePNGInfo *)&in_RDI->chrm_defined,(uchar *)info,
                                       (ulong)uVar2);
            }
          }
          else {
            local_4 = readChunk_tRNS((LodePNGColorMode *)&in_RDI->chrm_red_y,(uchar *)info,
                                     (ulong)uVar2);
          }
        }
        else {
          local_4 = readChunk_PLTE((LodePNGColorMode *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                   (uchar *)info,CONCAT44(iVar3,local_4));
        }
        if ((((local_4 == 0) && (iVar3 == 0)) && ((in_RDI->color).key_defined == 0)) &&
           (uVar2 = lodepng_chunk_check_crc((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8)),
           uVar2 != 0)) {
          local_4 = 0x39;
        }
      }
    }
    else {
      local_4 = 0x3f;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_inspect_chunk(LodePNGState* state, size_t pos,
                               const unsigned char* in, size_t insize) {
  const unsigned char* chunk = in + pos;
  unsigned chunkLength;
  const unsigned char* data;
  unsigned unhandled = 0;
  unsigned error = 0;

  if(pos + 4 > insize) return 30;
  chunkLength = lodepng_chunk_length(chunk);
  if(chunkLength > 2147483647) return 63;
  data = lodepng_chunk_data_const(chunk);
  if(chunkLength + 12 > insize - pos) return 30;

  if(lodepng_chunk_type_equals(chunk, "PLTE")) {
    error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
    error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
    error = readChunk_bKGD(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
    error = readChunk_tEXt(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
    error = readChunk_zTXt(&state->info_png, &state->decoder, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
    error = readChunk_iTXt(&state->info_png, &state->decoder, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
    error = readChunk_tIME(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
    error = readChunk_pHYs(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
    error = readChunk_gAMA(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
    error = readChunk_cHRM(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
    error = readChunk_sRGB(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
    error = readChunk_iCCP(&state->info_png, &state->decoder, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cICP")) {
    error = readChunk_cICP(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "mDCv")) {
    error = readChunk_mDCv(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cLLi")) {
    error = readChunk_cLLi(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "eXIf")) {
    error = readChunk_eXIf(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "sBIT")) {
    error = readChunk_sBIT(&state->info_png, data, chunkLength);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  } else {
    /* unhandled chunk is ok (is not an error) */
    unhandled = 1;
  }

  if(!error && !unhandled && !state->decoder.ignore_crc) {
    if(lodepng_chunk_check_crc(chunk)) return 57; /*invalid CRC*/
  }

  return error;
}